

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

float ImGui::TableGetMaxColumnWidth(ImGuiTable *table,int column_n)

{
  float fVar1;
  float fVar2;
  ImGuiTableColumn *pIVar3;
  float fVar4;
  
  if ((-1 < column_n) &&
     (pIVar3 = (table->Columns).Data + column_n, pIVar3 < (table->Columns).DataEnd)) {
    fVar1 = table->CellPaddingX;
    fVar2 = table->CellSpacingX2;
    fVar4 = table->MinColumnWidth + fVar1 + fVar1 + table->CellSpacingX1 + fVar2;
    if (((uint)table->Flags >> 0x18 & 1) == 0) {
      if (((uint)table->Flags >> 0x12 & 1) == 0) {
        return (((((table->WorkRect).Max.x -
                  (float)(~(int)pIVar3->IndexWithinEnabledSet + (int)table->ColumnsEnabledCount) *
                  fVar4) - pIVar3->MinX) - fVar2) - (fVar1 + fVar1)) - table->OuterPaddingX;
      }
    }
    else if (pIVar3->DisplayOrder < table->FreezeColumnsRequest) {
      return (((((table->InnerClipRect).Max.x -
                (float)((int)table->FreezeColumnsRequest - (int)pIVar3->DisplayOrder) * fVar4) -
               pIVar3->MinX) - table->OuterPaddingX) - fVar1) - fVar2;
    }
    return 3.4028235e+38;
  }
  __assert_fail("p >= Data && p < DataEnd",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_internal.h"
                ,0x24b,
                "const T &ImSpan<ImGuiTableColumn>::operator[](int) const [T = ImGuiTableColumn]");
}

Assistant:

inline const T&     operator[](int i) const     { const T* p = Data + i; IM_ASSERT(p >= Data && p < DataEnd); return *p; }